

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall Catch::JsonReporter::testRunEnded(JsonReporter *this,TestRunStats *runStats)

{
  _Elt_pointer pJVar1;
  JsonObjectWriter totals;
  char local_1e9;
  JsonObjectWriter local_1e8;
  JsonObjectWriter local_1d0;
  undefined1 local_1b8 [136];
  ios_base local_130 [264];
  uint64_t local_28;
  
  std::deque<Catch::JsonArrayWriter,_std::allocator<Catch::JsonArrayWriter>_>::pop_back
            (&(this->m_arrayWriters).c);
  std::deque<Catch::JsonReporter::Writer,_std::allocator<Catch::JsonReporter::Writer>_>::pop_back
            (&(this->m_writers).c);
  pJVar1 = (this->m_objectWriters).c.
           super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pJVar1 == (this->m_objectWriters).c.
                super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pJVar1 = (this->m_objectWriters).c.
             super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
  }
  JsonObjectWriter::write((JsonObjectWriter *)local_1b8,(int)pJVar1 + -0x18,"totals",6);
  local_1d0.m_os = (ostream *)local_1b8._0_8_;
  local_1d0.m_indent_level = local_28;
  local_1d0.m_should_comma = false;
  local_1d0.m_active = true;
  local_1e8.m_os = (ostream *)CONCAT71(local_1e8.m_os._1_7_,0x7b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1b8._0_8_,(char *)&local_1e8,1);
  std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b8 + 8));
  std::ios_base::~ios_base(local_130);
  JsonObjectWriter::write((JsonObjectWriter *)local_1b8,(int)&local_1d0,"assertions",10);
  local_1e8.m_os = (ostream *)local_1b8._0_8_;
  local_1e8.m_indent_level = local_28;
  local_1e8.m_should_comma = false;
  local_1e8.m_active = true;
  local_1e9 = '{';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8._0_8_,&local_1e9,1);
  writeCounts(&local_1e8,&(runStats->totals).assertions);
  JsonObjectWriter::~JsonObjectWriter(&local_1e8);
  std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b8 + 8));
  std::ios_base::~ios_base(local_130);
  JsonObjectWriter::write((JsonObjectWriter *)local_1b8,(int)&local_1d0,"test-cases",10);
  local_1e8.m_os = (ostream *)local_1b8._0_8_;
  local_1e8.m_indent_level = local_28;
  local_1e8.m_should_comma = false;
  local_1e8.m_active = true;
  local_1e9 = '{';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8._0_8_,&local_1e9,1);
  writeCounts(&local_1e8,&(runStats->totals).testCases);
  JsonObjectWriter::~JsonObjectWriter(&local_1e8);
  std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b8 + 8));
  std::ios_base::~ios_base(local_130);
  JsonObjectWriter::~JsonObjectWriter(&local_1d0);
  std::deque<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>::pop_back
            (&(this->m_objectWriters).c);
  std::deque<Catch::JsonReporter::Writer,_std::allocator<Catch::JsonReporter::Writer>_>::pop_back
            (&(this->m_writers).c);
  return;
}

Assistant:

void JsonReporter::testRunEnded(TestRunStats const& runStats) {
        assert( isInside( Writer::Array ) );
        // End "test-cases"
        endArray();

        {
            auto totals =
                m_objectWriters.top().write( "totals"_sr ).writeObject();
            writeCounts( totals.write( "assertions"_sr ).writeObject(),
                         runStats.totals.assertions );
            writeCounts( totals.write( "test-cases"_sr ).writeObject(),
                         runStats.totals.testCases );
        }

        // End the "test-run" object
        endObject();
    }